

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O1

void __thiscall
LoaderLogger::AddLogRecorderForXrInstance
          (LoaderLogger *this,XrInstance instance,
          unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *recorder)

{
  __hashtable *__h;
  unique_lock<std::shared_timed_mutex> lock;
  __node_gen_type __node_gen;
  unique_lock<std::shared_timed_mutex> local_48;
  uint64_t local_38;
  XrInstance local_30;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_28;
  
  local_48._M_owns = false;
  local_48._M_device = &this->_mutex;
  local_30 = instance;
  std::unique_lock<std::shared_timed_mutex>::lock(&local_48);
  local_48._M_owns = true;
  local_28 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)std::__detail::
                _Map_base<XrInstance_T_*,_std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<XrInstance_T_*,_std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->_recordersByInstance,&local_30);
  local_38 = ((recorder->_M_t).
              super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t
              .super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
              super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id;
  std::
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
            (local_28);
  std::
  vector<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>,std::allocator<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>>>
  ::emplace_back<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>>
            ((vector<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>,std::allocator<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>>>
              *)&this->_recorders,recorder);
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_48);
  return;
}

Assistant:

void LoaderLogger::AddLogRecorderForXrInstance(XrInstance instance, std::unique_ptr<LoaderLogRecorder>&& recorder) {
    std::unique_lock<std::shared_timed_mutex> lock(_mutex);
    _recordersByInstance[instance].insert(recorder->UniqueId());
    _recorders.emplace_back(std::move(recorder));
}